

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_xor(void **param_1)

{
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *expression;
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *in_RDI;
  roaring64_bitmap_t *r3;
  roaring64_bitmap_t *r2;
  roaring64_bitmap_t *r1;
  roaring64_bitmap_t *in_stack_00000070;
  roaring64_bitmap_t *in_stack_00000158;
  roaring64_bitmap_t *in_stack_00000160;
  int in_stack_ffffffffffffffdc;
  
  r = roaring64_bitmap_create();
  expression = roaring64_bitmap_create();
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  roaring64_bitmap_add(r,(uint64_t)expression);
  b = roaring64_bitmap_xor(in_stack_00000160,in_stack_00000158);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_contains(in_RDI,(uint64_t)r);
  _assert_true((unsigned_long)r,(char *)expression,(char *)b,in_stack_ffffffffffffffdc);
  roaring64_bitmap_free(in_stack_00000070);
  roaring64_bitmap_free(in_stack_00000070);
  roaring64_bitmap_free(in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_xor) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    roaring64_bitmap_t* r2 = roaring64_bitmap_create();

    roaring64_bitmap_add(r1, 100000);
    roaring64_bitmap_add(r1, 100001);
    roaring64_bitmap_add(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    roaring64_bitmap_add(r2, 100001);
    roaring64_bitmap_add(r2, 200000);
    roaring64_bitmap_add(r2, 400000);

    roaring64_bitmap_t* r3 = roaring64_bitmap_xor(r1, r2);

    assert_r64_valid(r3);
    assert_true(roaring64_bitmap_contains(r3, 100000));
    assert_false(roaring64_bitmap_contains(r3, 100001));
    assert_false(roaring64_bitmap_contains(r3, 200000));
    assert_true(roaring64_bitmap_contains(r3, 300000));
    assert_true(roaring64_bitmap_contains(r3, 400000));

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
    roaring64_bitmap_free(r3);
}